

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::GenerateDynamicObjectAlloc
          (Lowerer *this,Instr *newObjInstr,uint inlineSlotCount,uint slotCount,RegOpnd *newObjDst,
          Opnd *typeSrc)

{
  bool isZeroed_00;
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  DWORD DVar2;
  Opnd *pOVar3;
  Opnd *value;
  RegOpnd *newObjDst_00;
  IndirOpnd *dst;
  uint uVar4;
  IndirOpnd *newObjAuxSlots;
  RegOpnd *auxSlots;
  size_t auxSlotsAllocSize;
  SymOpnd *pSStack_40;
  bool isZeroed;
  SymOpnd *tempObjectSymOpnd;
  size_t headerAllocSize;
  Opnd *typeSrc_local;
  RegOpnd *newObjDst_local;
  uint slotCount_local;
  uint inlineSlotCount_local;
  Instr *newObjInstr_local;
  Lowerer *this_local;
  
  tempObjectSymOpnd = (SymOpnd *)((ulong)inlineSlotCount * 8 + 0x20);
  headerAllocSize = (size_t)typeSrc;
  typeSrc_local = &newObjDst->super_Opnd;
  newObjDst_local._0_4_ = slotCount;
  newObjDst_local._4_4_ = inlineSlotCount;
  _slotCount_local = newObjInstr;
  newObjInstr_local = (Instr *)this;
  isZeroed_00 = GenerateRecyclerOrMarkTempAlloc
                          (this,newObjInstr,newObjDst,HelperAllocMemForScObject,
                           (size_t)tempObjectSymOpnd,&stack0xffffffffffffffc0);
  if (pSStack_40 != (SymOpnd *)0x0) {
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01eafdf0,HoistMarkTempInitPhase,sourceContextId,functionId);
    if ((!bVar1) && (this->outerMostLoopLabel != (LabelInstr *)0x0)) {
      pOVar3 = LoadVTableValueOpnd(this,&this->outerMostLoopLabel->super_Instr,VtableDynamicObject);
      InsertMove(&pSStack_40->super_Opnd,pOVar3,&this->outerMostLoopLabel->super_Instr,false);
      goto LAB_007b7a1f;
    }
  }
  pOVar3 = typeSrc_local;
  value = LoadVTableValueOpnd(this,_slotCount_local,VtableDynamicObject);
  GenerateMemInit(this,(RegOpnd *)pOVar3,0,value,_slotCount_local,isZeroed_00);
LAB_007b7a1f:
  pOVar3 = typeSrc_local;
  DVar2 = Js::DynamicObject::GetOffsetOfType();
  GenerateMemInit(this,(RegOpnd *)pOVar3,DVar2,(Opnd *)headerAllocSize,_slotCount_local,isZeroed_00)
  ;
  pOVar3 = typeSrc_local;
  if (newObjDst_local._4_4_ < (uint)newObjDst_local) {
    uVar4 = (uint)newObjDst_local - newObjDst_local._4_4_;
    newObjDst_00 = IR::RegOpnd::New(TyUint64,this->m_func);
    GenerateRecyclerAllocAligned
              (this,HelperAllocMemForVarArray,(ulong)uVar4 << 3,newObjDst_00,_slotCount_local,false)
    ;
    pOVar3 = typeSrc_local;
    DVar2 = Js::DynamicObject::GetOffsetOfAuxSlots();
    GenerateMemInit(this,(RegOpnd *)pOVar3,DVar2,&newObjDst_00->super_Opnd,_slotCount_local,
                    isZeroed_00);
    pOVar3 = typeSrc_local;
    DVar2 = Js::DynamicObject::GetOffsetOfAuxSlots();
    dst = IR::IndirOpnd::New((RegOpnd *)pOVar3,DVar2,TyUint64,this->m_func,false);
    InsertMove(&dst->super_Opnd,&newObjDst_00->super_Opnd,_slotCount_local,true);
  }
  else {
    DVar2 = Js::DynamicObject::GetOffsetOfAuxSlots();
    GenerateMemInitNull(this,(RegOpnd *)pOVar3,DVar2,_slotCount_local,isZeroed_00);
  }
  pOVar3 = typeSrc_local;
  DVar2 = Js::DynamicObject::GetOffsetOfObjectArray();
  GenerateMemInitNull(this,(RegOpnd *)pOVar3,DVar2,_slotCount_local,isZeroed_00);
  return;
}

Assistant:

void
Lowerer::GenerateDynamicObjectAlloc(IR::Instr * newObjInstr, uint inlineSlotCount, uint slotCount, IR::RegOpnd * newObjDst, IR::Opnd * typeSrc)
{
    size_t headerAllocSize = sizeof(Js::DynamicObject) + inlineSlotCount * sizeof(Js::Var);
    IR::SymOpnd * tempObjectSymOpnd;
    bool isZeroed = GenerateRecyclerOrMarkTempAlloc(newObjInstr, newObjDst, IR::HelperAllocMemForScObject, headerAllocSize, &tempObjectSymOpnd);

    if (tempObjectSymOpnd && !PHASE_OFF(Js::HoistMarkTempInitPhase, this->m_func) && this->outerMostLoopLabel)
    {
        // Hoist the vtable init to the outer most loop top as it never changes
        InsertMove(tempObjectSymOpnd,
            LoadVTableValueOpnd(this->outerMostLoopLabel, VTableValue::VtableDynamicObject), this->outerMostLoopLabel, false);
    }
    else
    {
        // MOV [newObjDst + offset(vtable)], DynamicObject::vtable
        GenerateMemInit(newObjDst, 0, LoadVTableValueOpnd(newObjInstr, VTableValue::VtableDynamicObject), newObjInstr, isZeroed);
    }
    // MOV [newObjDst + offset(type)], newObjectType
    GenerateMemInit(newObjDst, Js::DynamicObject::GetOffsetOfType(), typeSrc, newObjInstr, isZeroed);

    // CALL JavascriptOperators::AllocMemForVarArray((slotCount - inlineSlotCount) * sizeof(Js::Var))
    if (slotCount > inlineSlotCount)
    {
        size_t auxSlotsAllocSize = (slotCount - inlineSlotCount) * sizeof(Js::Var);
        IR::RegOpnd* auxSlots = IR::RegOpnd::New(TyMachPtr, m_func);

        GenerateRecyclerAllocAligned(IR::HelperAllocMemForVarArray, auxSlotsAllocSize, auxSlots, newObjInstr);
        GenerateMemInit(newObjDst, Js::DynamicObject::GetOffsetOfAuxSlots(), auxSlots, newObjInstr, isZeroed);

        IR::IndirOpnd* newObjAuxSlots = IR::IndirOpnd::New(newObjDst, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachPtr, m_func);
        this->InsertMove(newObjAuxSlots, auxSlots, newObjInstr);
    }
    else
    {
        GenerateMemInitNull(newObjDst, Js::DynamicObject::GetOffsetOfAuxSlots(), newObjInstr, isZeroed);
    }

    GenerateMemInitNull(newObjDst, Js::DynamicObject::GetOffsetOfObjectArray(), newObjInstr, isZeroed);
}